

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void __thiscall deqp::gls::FboUtil::ValidStatusCodes::logRules(ValidStatusCodes *this,TestLog *log)

{
  int iVar1;
  ScopedLogSection SVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  allocator<char> local_159;
  string local_158;
  _Base_ptr local_138;
  undefined1 local_130;
  allocator<char> local_121;
  value_type local_120;
  undefined1 local_100 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defaultRule;
  string local_c8;
  int local_a8;
  allocator<char> local_a1;
  int ndx_1;
  int local_80;
  allocator<char> local_79;
  int ndx;
  allocator<char> local_41;
  string local_40;
  ScopedLogSection local_20;
  ScopedLogSection section;
  TestLog *log_local;
  ValidStatusCodes *this_local;
  
  section.m_log = log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Rules",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ndx,"Active rules",&local_79);
  tcu::ScopedLogSection::ScopedLogSection(&local_20,log,&local_40,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_80 = 0;
  while( true ) {
    iVar1 = local_80;
    sVar3 = std::
            vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
            ::size(&this->m_errorCodes);
    SVar2 = section;
    if ((int)sVar3 <= iVar1) break;
    pvVar4 = std::
             vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
             ::operator[](&this->m_errorCodes,(long)local_80);
    pcVar5 = glu::getErrorName(pvVar4->errorCode);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&ndx_1,pcVar5,&local_a1);
    pvVar4 = std::
             vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
             ::operator[](&this->m_errorCodes,(long)local_80);
    logRule(this,SVar2.m_log,(string *)&ndx_1,&pvVar4->rules);
    std::__cxx11::string::~string((string *)&ndx_1);
    std::allocator<char>::~allocator(&local_a1);
    local_80 = local_80 + 1;
  }
  local_a8 = 0;
  while( true ) {
    iVar1 = local_a8;
    sVar3 = std::
            vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
            ::size(&this->m_errorStatuses);
    SVar2 = section;
    if ((int)sVar3 <= iVar1) break;
    pvVar4 = std::
             vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
             ::operator[](&this->m_errorStatuses,(long)local_a8);
    pcVar5 = glu::getFramebufferStatusName(pvVar4->errorCode);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,pcVar5,
               (allocator<char> *)
               ((long)&defaultRule._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    pvVar4 = std::
             vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
             ::operator[](&this->m_errorStatuses,(long)local_a8);
    logRule(this,SVar2.m_log,&local_c8,&pvVar4->rules);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&defaultRule._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    local_a8 = local_a8 + 1;
  }
  if ((this->m_allowComplete & 1U) != 0) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"FBO is complete",&local_121);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_100,&local_120);
    local_138 = (_Base_ptr)pVar6.first._M_node;
    local_130 = pVar6.second;
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    SVar2 = section;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"GL_FRAMEBUFFER_COMPLETE",&local_159);
    logRule(this,SVar2.m_log,&local_158,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_100);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_20);
  return;
}

Assistant:

void ValidStatusCodes::logRules (tcu::TestLog& log) const
{
	const tcu::ScopedLogSection section(log, "Rules", "Active rules");

	for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		logRule(log, glu::getErrorName(m_errorCodes[ndx].errorCode), m_errorCodes[ndx].rules);

	for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		logRule(log, glu::getFramebufferStatusName(m_errorStatuses[ndx].errorCode), m_errorStatuses[ndx].rules);

	if (m_allowComplete)
	{
		std::set<std::string> defaultRule;
		defaultRule.insert("FBO is complete");
		logRule(log, "GL_FRAMEBUFFER_COMPLETE", defaultRule);
	}
}